

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__zexpand(stbi__zbuf *z,char *zout,int n)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long in_FS_OFFSET;
  
  z->zout = zout;
  if (z->z_expandable != 0) {
    iVar1 = (int)z->zout_start;
    iVar4 = (int)zout - iVar1;
    iVar1 = *(int *)&z->zout_end - iVar1;
    do {
      iVar2 = iVar1;
      iVar1 = iVar2 * 2;
    } while (iVar2 < n + iVar4);
    pcVar3 = (char *)realloc(z->zout_start,(long)iVar2);
    if (pcVar3 == (char *)0x0) {
      *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
    }
    else {
      z->zout_start = pcVar3;
      z->zout = pcVar3 + iVar4;
      z->zout_end = pcVar3 + iVar2;
    }
    return (uint)(pcVar3 != (char *)0x0);
  }
  *(char **)(in_FS_OFFSET + -0x10) = "Corrupt PNG";
  return 0;
}

Assistant:

static int stbi__zexpand(stbi__zbuf *z, char *zout, int n)  // need to make room for n bytes
{
   char *q;
   int cur, limit, old_limit;
   z->zout = zout;
   if (!z->z_expandable) return stbi__err("output buffer limit","Corrupt PNG");
   cur   = (int) (z->zout     - z->zout_start);
   limit = old_limit = (int) (z->zout_end - z->zout_start);
   while (cur + n > limit)
      limit *= 2;
   q = (char *) STBI_REALLOC_SIZED(z->zout_start, old_limit, limit);
   STBI_NOTUSED(old_limit);
   if (q == NULL) return stbi__err("outofmem", "Out of memory");
   z->zout_start = q;
   z->zout       = q + cur;
   z->zout_end   = q + limit;
   return 1;
}